

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

char * __thiscall
cmCustomCommandGenerator::GetCrossCompilingEmulator(cmCustomCommandGenerator *this,uint c)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  cmMakefile *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  allocator<char> local_89;
  string local_88;
  cmGeneratorTarget *local_68;
  cmGeneratorTarget *target;
  string *argv0;
  allocator<char> local_41;
  string local_40;
  uint local_1c;
  cmCustomCommandGenerator *pcStack_18;
  uint c_local;
  cmCustomCommandGenerator *this_local;
  
  local_1c = c;
  pcStack_18 = this;
  this_01 = cmLocalGenerator::GetMakefile(this->LG);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_CROSSCOMPILING",&local_41);
  bVar1 = cmMakefile::IsOn(this_01,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_02 = &std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::operator[]
                         (&(this->CommandLines).
                           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                          (ulong)local_1c)->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    target = (cmGeneratorTarget *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](this_02,0);
    local_68 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,(string *)target);
    if (((local_68 != (cmGeneratorTarget *)0x0) &&
        (TVar2 = cmGeneratorTarget::GetType(local_68), TVar2 == EXECUTABLE)) &&
       (bVar1 = cmGeneratorTarget::IsImported(local_68), this_00 = local_68, !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"CROSSCOMPILING_EMULATOR",&local_89);
      this_local = (cmCustomCommandGenerator *)cmGeneratorTarget::GetProperty(this_00,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      return (char *)this_local;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* cmCustomCommandGenerator::GetCrossCompilingEmulator(
  unsigned int c) const
{
  if (!this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")) {
    return nullptr;
  }
  std::string const& argv0 = this->CommandLines[c][0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(argv0);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE &&
      !target->IsImported()) {
    return target->GetProperty("CROSSCOMPILING_EMULATOR");
  }
  return nullptr;
}